

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_bytein(opj_mqc_t *mqc)

{
  uchar *puVar1;
  byte bVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  puVar3 = mqc->bp;
  uVar4 = 8;
  iVar6 = 0xff00;
  if (puVar3 != mqc->end) {
    puVar1 = puVar3 + 1;
    if (puVar1 == mqc->end) {
      uVar5 = 0xff;
      if (*puVar3 == 0xff) goto LAB_001f9ed9;
    }
    else {
      bVar2 = puVar3[1];
      uVar5 = (uint)bVar2;
      if (*puVar3 == 0xff) {
        if (bVar2 < 0x90) {
          mqc->bp = puVar1;
          iVar6 = (uint)bVar2 << 9;
          uVar4 = 7;
        }
        goto LAB_001f9ed9;
      }
    }
    mqc->bp = puVar1;
    iVar6 = uVar5 << 8;
  }
LAB_001f9ed9:
  mqc->c = mqc->c + iVar6;
  mqc->ct = uVar4;
  return;
}

Assistant:

static void mqc_bytein(opj_mqc_t *const mqc) {
	if (mqc->bp != mqc->end) {
		unsigned int c;
		if (mqc->bp + 1 != mqc->end) {
			c = *(mqc->bp + 1);
		} else {
			c = 0xff;
		}
		if (*mqc->bp == 0xff) {
			if (c > 0x8f) {
				mqc->c += 0xff00;
				mqc->ct = 8;
			} else {
				mqc->bp++;
				mqc->c += c << 9;
				mqc->ct = 7;
			}
		} else {
			mqc->bp++;
			mqc->c += c << 8;
			mqc->ct = 8;
		}
	} else {
		mqc->c += 0xff00;
		mqc->ct = 8;
	}
}